

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_Reset(ym3438_t *chip,Bit32u rate,Bit32u clock)

{
  Bit32s BVar1;
  uint local_1c;
  Bit32u rateratio;
  Bit32u i;
  Bit32u clock_local;
  Bit32u rate_local;
  ym3438_t *chip_local;
  
  BVar1 = chip->rateratio;
  memset(chip,0,0x8560);
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    chip->eg_out[local_1c] = 0x3ff;
    chip->eg_level[local_1c] = 0x3ff;
    chip->eg_state[local_1c] = '\x03';
    chip->multi[local_1c] = '\x01';
  }
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    chip->pan_l[local_1c] = '\x01';
    chip->pan_r[local_1c] = '\x01';
    chip->pan_volume_l[local_1c] = 0xb504;
    chip->pan_volume_r[local_1c] = 0xb504;
  }
  if (rate == 0) {
    chip->rateratio = BVar1;
  }
  else {
    chip->rateratio = (Bit32s)(((ulong)rate * 0x24000) / (ulong)clock);
  }
  return;
}

Assistant:

void OPN2_Reset(ym3438_t *chip, Bit32u rate, Bit32u clock)
{
    Bit32u i, rateratio;
    rateratio = (Bit32u)chip->rateratio;
    memset(chip, 0, sizeof(ym3438_t));
    for (i = 0; i < 24; i++)
    {
        chip->eg_out[i] = 0x3ff;
        chip->eg_level[i] = 0x3ff;
        chip->eg_state[i] = eg_num_release;
        chip->multi[i] = 1;
    }
    for (i = 0; i < 6; i++)
    {
        chip->pan_l[i] = 1;
        chip->pan_r[i] = 1;
        chip->pan_volume_l[i] = 46340;
        chip->pan_volume_r[i] = 46340;
    }

    if (rate != 0)
    {
        chip->rateratio = (Bit32s)(Bit32u)((((Bit64u)144 * rate) << RSM_FRAC) / clock);
    }
    else
    {
        chip->rateratio = (Bit32s)rateratio;
    }
}